

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.h
# Opt level: O0

void __thiscall
TTD::FileWriter::WriteFormattedCharData<6ul,double>
          (FileWriter *this,char16 (*formatString) [6],double data)

{
  uint uVar1;
  char16_t_conflict *string;
  int local_40;
  int addedBytes;
  int addedChars;
  byte *trgtBuff;
  double data_local;
  char16 (*formatString_local) [6];
  FileWriter *this_local;
  
  string = (char16_t_conflict *)ReserveSpaceForSmallData<128ul>(this);
  uVar1 = swprintf_s(string,0x40,(char16_t_conflict *)formatString,data);
  if ((uVar1 != 0xffffffff) && (uVar1 < 0x40)) {
    if (uVar1 == 0xffffffff) {
      local_40 = 0;
    }
    else {
      local_40 = uVar1 << 1;
    }
    CommitSpaceForSmallData(this,(long)local_40);
    return;
  }
  TTDAbort_unrecoverable_error("Formatting failed or result is too big.");
}

Assistant:

void WriteFormattedCharData(const char16(&formatString)[N], T data)
        {
            byte* trgtBuff = this->ReserveSpaceForSmallData<TTD_SERIALIZATION_MAX_FORMATTED_DATA_SIZE>();

            int addedChars = swprintf_s((char16*)trgtBuff, (TTD_SERIALIZATION_MAX_FORMATTED_DATA_SIZE / sizeof(char16)), formatString, data);
            TTDAssert(addedChars != -1 && addedChars < (TTD_SERIALIZATION_MAX_FORMATTED_DATA_SIZE / sizeof(char16)), "Formatting failed or result is too big.");

            int addedBytes = (addedChars != -1) ? (addedChars * sizeof(char16)) : 0;
            this->CommitSpaceForSmallData(addedBytes);
        }